

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
* __thiscall
phmap::container_internal::
raw_hash_map<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
::try_emplace_impl<std::__cxx11::string_const&>
          (pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  long lVar1;
  long lVar2;
  pointer pcVar3;
  unsigned_long uVar4;
  pair<unsigned_long,_bool> pVar5;
  
  pVar5 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::find_or_prepare_insert<std::__cxx11::string>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)this,k);
  uVar4 = pVar5.first;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar2 = *(long *)((long)this + 8);
    lVar1 = lVar2 + 0x10 + uVar4 * 0x28;
    *(long *)(lVar1 + -0x10) = lVar1;
    pcVar3 = (k->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(lVar2 + uVar4 * 0x28),pcVar3,pcVar3 + k->_M_string_length);
    *(undefined4 *)(lVar1 + 0x10) = 0;
  }
  lVar1 = *(long *)((long)this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*this + uVar4);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(uVar4 * 0x28 + lVar1);
  __return_storage_ptr__->second = pVar5.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args) {
        auto res = this->find_or_prepare_insert(k);
        if (res.second)
            this->emplace_at(res.first, std::piecewise_construct,
                             std::forward_as_tuple(std::forward<K>(k)),
                             std::forward_as_tuple(std::forward<Args>(args)...));
        return {this->iterator_at(res.first), res.second};
    }